

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O0

QString * appendSlashIfNeeded(QString *path)

{
  bool bVar1;
  QStringBuilder<const_QString_&,_char16_t> *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_char16_t> QVar2;
  QStringBuilder<const_QString_&,_char16_t> *in_stack_ffffffffffffffa8;
  QString *this;
  QString *pQVar3;
  QChar local_1a;
  QString *local_18;
  char16_t local_10;
  long local_8;
  QChar c;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  pQVar3 = in_RDI;
  bVar1 = QString::isEmpty((QString *)0x1919e3);
  c.ucs = (char16_t)((ulong)pQVar3 >> 0x30);
  if (!bVar1) {
    QChar::QChar<char16_t,_true>(&local_1a,L'/');
    bVar1 = QString::endsWith(this,c,(CaseSensitivity)((ulong)in_RDI >> 0x20));
    in_stack_ffffffffffffffa8 = in_RSI;
    if (!bVar1) {
      QVar2 = operator+(this,(char16_t *)in_RDI);
      local_18 = QVar2.a;
      local_10 = QVar2.b;
      QStringBuilder::operator_cast_to_QString(in_RSI);
      goto LAB_00191a6a;
    }
  }
  QString::QString(in_RDI,(QString *)in_stack_ffffffffffffffa8);
LAB_00191a6a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

static QString appendSlashIfNeeded(const QString &path)
{
    if (!path.isEmpty() && !path.endsWith(u'/')
#ifdef Q_OS_ANDROID
        && !path.startsWith("content:/"_L1)
#endif
        )
        return QString{path + u'/'};
    return path;
}